

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eviction.cpp
# Opt level: O1

optional<long>
SelectNodeToEvict(vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                  *vEvictionCandidates)

{
  pointer pNVar1;
  pointer pNVar2;
  pointer pNVar3;
  vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>> *this;
  ulong uVar4;
  mapped_type *pmVar5;
  long lVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  ulong uVar8;
  pointer pNVar9;
  NodeEvictionCandidate *pNVar10;
  pointer pNVar11;
  iterator __position;
  long lVar12;
  NodeEvictionCandidate *node;
  long in_FS_OFFSET;
  bool bVar13;
  byte bVar14;
  optional<long> oVar15;
  uint64_t naMostConnections;
  map<unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
  mapNetGroupNodes;
  uint64_t local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
  local_68;
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ProtectNoBanConnections(vEvictionCandidates);
  ProtectOutboundConnections(vEvictionCandidates);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,CompareNetGroupKeyed,4,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,ReverseCompareNodeMinPingTime,8,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,CompareNodeTXTime,4,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:197:24)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:197:24)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,CompareNodeBlockRelayOnlyTime,8,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(const_NodeEvictionCandidate_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/eviction.cpp:80:67)>
             ::_M_manager;
  EraseLastKElements<NodeEvictionCandidate,bool(*)(NodeEvictionCandidate_const&,NodeEvictionCandidate_const&)>
            (vEvictionCandidates,CompareNodeBlockTime,4,
             (function<bool_(const_NodeEvictionCandidate_&)> *)&local_108);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  ProtectEvictionCandidatesByRatio(vEvictionCandidates);
  pNVar3 = (vEvictionCandidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (vEvictionCandidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pNVar3 == pNVar1) {
    uVar7 = 0;
    goto LAB_00229cc6;
  }
  lVar6 = ((long)pNVar1 - (long)pNVar3 >> 3) * -0x71c71c71c71c71c7 >> 2;
  pNVar2 = pNVar3;
  if (0 < lVar6) {
    pNVar2 = pNVar3 + lVar6 * 4;
    lVar12 = lVar6 + 1;
    pNVar9 = pNVar3 + 2;
    do {
      if (pNVar9[-2].prefer_evict != false) {
        pNVar9 = pNVar9 + -2;
        goto LAB_00229ace;
      }
      if (pNVar9[-1].prefer_evict != false) {
        pNVar9 = pNVar9 + -1;
        goto LAB_00229ace;
      }
      if (pNVar9->prefer_evict != false) goto LAB_00229ace;
      if (pNVar9[1].prefer_evict != false) {
        pNVar9 = pNVar9 + 1;
        goto LAB_00229ace;
      }
      lVar12 = lVar12 + -1;
      pNVar9 = pNVar9 + 4;
    } while (1 < lVar12);
  }
  lVar12 = ((long)pNVar1 - (long)pNVar2 >> 3) * -0x71c71c71c71c71c7;
  if (lVar12 == 1) {
LAB_00229aa7:
    pNVar9 = pNVar2;
    if (pNVar2->prefer_evict == false) {
      pNVar9 = pNVar1;
    }
  }
  else if (lVar12 == 2) {
LAB_00229a9d:
    pNVar9 = pNVar2;
    if (pNVar2->prefer_evict == false) {
      pNVar2 = pNVar2 + 1;
      goto LAB_00229aa7;
    }
  }
  else {
    pNVar9 = pNVar1;
    if ((lVar12 == 3) && (pNVar9 = pNVar2, pNVar2->prefer_evict == false)) {
      pNVar2 = pNVar2 + 1;
      goto LAB_00229a9d;
    }
  }
LAB_00229ace:
  if (pNVar9 != pNVar1) {
    pNVar2 = pNVar3;
    if (0 < lVar6) {
      pNVar2 = pNVar3 + lVar6 * 4;
      lVar6 = lVar6 + 1;
      pNVar3 = pNVar3 + 2;
      do {
        if (pNVar3[-2].prefer_evict != true) {
          pNVar3 = pNVar3 + -2;
          goto LAB_00229b73;
        }
        if (pNVar3[-1].prefer_evict != true) {
          pNVar3 = pNVar3 + -1;
          goto LAB_00229b73;
        }
        if (pNVar3->prefer_evict != true) goto LAB_00229b73;
        if (pNVar3[1].prefer_evict != true) {
          pNVar3 = pNVar3 + 1;
          goto LAB_00229b73;
        }
        lVar6 = lVar6 + -1;
        pNVar3 = pNVar3 + 4;
      } while (1 < lVar6);
    }
    lVar6 = ((long)pNVar1 - (long)pNVar2 >> 3) * -0x71c71c71c71c71c7;
    if (lVar6 == 1) {
LAB_00229b54:
      pNVar3 = pNVar2;
      if (pNVar2->prefer_evict != false) {
        pNVar3 = pNVar1;
      }
    }
    else if (lVar6 == 2) {
LAB_00229b4a:
      pNVar3 = pNVar2;
      if (pNVar2->prefer_evict == true) {
        pNVar2 = pNVar2 + 1;
        goto LAB_00229b54;
      }
    }
    else {
      pNVar3 = pNVar1;
      if ((lVar6 == 3) && (pNVar3 = pNVar2, pNVar2->prefer_evict == true)) {
        pNVar2 = pNVar2 + 1;
        goto LAB_00229b4a;
      }
    }
LAB_00229b73:
    pNVar2 = pNVar3 + 1;
    if (pNVar2 != pNVar1 && pNVar3 != pNVar1) {
      do {
        if (pNVar2->prefer_evict == true) {
          pNVar9 = pNVar2;
          pNVar11 = pNVar3;
          for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
            pNVar11->id = pNVar9->id;
            pNVar9 = (pointer)((long)pNVar9 + (ulong)bVar14 * -0x10 + 8);
            pNVar11 = (pointer)((long)pNVar11 + (ulong)bVar14 * -0x10 + 8);
          }
          pNVar3 = pNVar3 + 1;
        }
        pNVar2 = pNVar2 + 1;
      } while (pNVar2 != pNVar1);
    }
    pNVar1 = (vEvictionCandidates->
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pNVar3 != pNVar1) &&
       (pNVar2 = (vEvictionCandidates->
                 super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
       pNVar3 = (pointer)((long)pNVar3 + ((long)pNVar2 - (long)pNVar1)), pNVar2 != pNVar3)) {
      (vEvictionCandidates->
      super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
      super__Vector_impl_data._M_finish = pNVar3;
    }
  }
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar8 = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  pNVar3 = (vEvictionCandidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (vEvictionCandidates->
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pNVar3 != pNVar1) {
    lVar6 = 0;
    do {
      this = (vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>> *)
             std::
             map<unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
             ::operator[]((map<unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
                           *)&local_68,&pNVar3->nKeyedNetGroup);
      __position._M_current = *(NodeEvictionCandidate **)(this + 8);
      if (__position._M_current == *(NodeEvictionCandidate **)(this + 0x10)) {
        std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>::
        _M_realloc_insert<NodeEvictionCandidate_const&>(this,__position,pNVar3);
      }
      else {
        pNVar10 = pNVar3;
        for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
          (__position._M_current)->id = pNVar10->id;
          pNVar10 = (NodeEvictionCandidate *)((long)pNVar10 + (ulong)bVar14 * -0x10 + 8);
          __position._M_current = __position._M_current + (ulong)bVar14 * -0x10 + 8;
        }
        *(long *)(this + 8) = *(long *)(this + 8) + 0x48;
      }
      lVar12 = *(long *)(*(long *)this + 8);
      uVar4 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x71c71c71c71c71c7;
      bVar13 = uVar4 - uVar8 != 0;
      if ((uVar8 <= uVar4 && bVar13) || ((!bVar13 && (lVar6 < lVar12)))) {
        local_110 = pNVar3->nKeyedNetGroup;
        uVar8 = uVar4 & 0xffffffff;
        lVar6 = lVar12;
      }
      pNVar3 = pNVar3 + 1;
    } while (pNVar3 != pNVar1);
  }
  pmVar5 = std::
           map<unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
           ::operator[]((map<unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
                         *)&local_68,&local_110);
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::_M_move_assign
            (vEvictionCandidates,pmVar5);
  vEvictionCandidates =
       (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
       ((_Storage<long,_true> *)
       (vEvictionCandidates->
       super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
       super__Vector_impl_data._M_start)->_M_value;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>_>_>
  ::~_Rb_tree(&local_68);
  uVar7 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00229cc6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  oVar15.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
       = uVar7;
  oVar15.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)(_Storage<long,_true>)vEvictionCandidates;
  return (optional<long>)
         oVar15.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
  ;
}

Assistant:

[[nodiscard]] std::optional<NodeId> SelectNodeToEvict(std::vector<NodeEvictionCandidate>&& vEvictionCandidates)
{
    // Protect connections with certain characteristics

    ProtectNoBanConnections(vEvictionCandidates);

    ProtectOutboundConnections(vEvictionCandidates);

    // Deterministically select 4 peers to protect by netgroup.
    // An attacker cannot predict which netgroups will be protected
    EraseLastKElements(vEvictionCandidates, CompareNetGroupKeyed, 4);
    // Protect the 8 nodes with the lowest minimum ping time.
    // An attacker cannot manipulate this metric without physically moving nodes closer to the target.
    EraseLastKElements(vEvictionCandidates, ReverseCompareNodeMinPingTime, 8);
    // Protect 4 nodes that most recently sent us novel transactions accepted into our mempool.
    // An attacker cannot manipulate this metric without performing useful work.
    EraseLastKElements(vEvictionCandidates, CompareNodeTXTime, 4);
    // Protect up to 8 non-tx-relay peers that have sent us novel blocks.
    EraseLastKElements(vEvictionCandidates, CompareNodeBlockRelayOnlyTime, 8,
                       [](const NodeEvictionCandidate& n) { return !n.m_relay_txs && n.fRelevantServices; });

    // Protect 4 nodes that most recently sent us novel blocks.
    // An attacker cannot manipulate this metric without performing useful work.
    EraseLastKElements(vEvictionCandidates, CompareNodeBlockTime, 4);

    // Protect some of the remaining eviction candidates by ratios of desirable
    // or disadvantaged characteristics.
    ProtectEvictionCandidatesByRatio(vEvictionCandidates);

    if (vEvictionCandidates.empty()) return std::nullopt;

    // If any remaining peers are preferred for eviction consider only them.
    // This happens after the other preferences since if a peer is really the best by other criteria (esp relaying blocks)
    //  then we probably don't want to evict it no matter what.
    if (std::any_of(vEvictionCandidates.begin(),vEvictionCandidates.end(),[](NodeEvictionCandidate const &n){return n.prefer_evict;})) {
        vEvictionCandidates.erase(std::remove_if(vEvictionCandidates.begin(),vEvictionCandidates.end(),
                                  [](NodeEvictionCandidate const &n){return !n.prefer_evict;}),vEvictionCandidates.end());
    }

    // Identify the network group with the most connections and youngest member.
    // (vEvictionCandidates is already sorted by reverse connect time)
    uint64_t naMostConnections;
    unsigned int nMostConnections = 0;
    std::chrono::seconds nMostConnectionsTime{0};
    std::map<uint64_t, std::vector<NodeEvictionCandidate> > mapNetGroupNodes;
    for (const NodeEvictionCandidate &node : vEvictionCandidates) {
        std::vector<NodeEvictionCandidate> &group = mapNetGroupNodes[node.nKeyedNetGroup];
        group.push_back(node);
        const auto grouptime{group[0].m_connected};

        if (group.size() > nMostConnections || (group.size() == nMostConnections && grouptime > nMostConnectionsTime)) {
            nMostConnections = group.size();
            nMostConnectionsTime = grouptime;
            naMostConnections = node.nKeyedNetGroup;
        }
    }

    // Reduce to the network group with the most connections
    vEvictionCandidates = std::move(mapNetGroupNodes[naMostConnections]);

    // Disconnect from the network group with the most connections
    return vEvictionCandidates.front().id;
}